

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.c
# Opt level: O2

int main(int argc,char **argv)

{
  byte *pbVar1;
  FILE *__stream;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint32_t value;
  char *pcVar5;
  undefined8 uVar6;
  uchar *compr;
  uchar *uncompr;
  ulong uVar7;
  long lVar8;
  long lVar9;
  int *piVar10;
  long lVar11;
  size_t sVar12;
  void *pvVar13;
  void *__ptr;
  undefined4 *__ptr_00;
  uint *__ptr_01;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  size_t sVar14;
  undefined8 in_R8;
  uint32_t check_dictionary_len;
  uchar *local_80a0;
  uint8_t local_8098 [8];
  undefined8 local_8090;
  uchar *local_8088;
  undefined4 local_8080;
  undefined8 local_8078;
  long local_8068;
  undefined8 local_8060;
  undefined8 uStack_8058;
  undefined8 local_8050;
  uint local_8044;
  uint8_t check_dictionary [32768];
  
  pcVar5 = (char *)zlibng_version();
  if (*pcVar5 != '2') {
    fwrite("incompatible zlib version\n",0x1a,1,_stderr);
    exit(1);
  }
  pcVar5 = (char *)zlibng_version();
  iVar2 = strcmp(pcVar5,"2.2.4");
  __stream = _stderr;
  if (iVar2 != 0) {
    uVar6 = zlibng_version();
    fprintf(__stream,"warning: different zlib version linked: %s\n",uVar6);
  }
  uVar6 = zng_zlibCompileFlags();
  printf("zlib-ng version %s = 0x%08lx, compile flags = 0x%lx\n","2.2.4",0x20204f0,uVar6);
  compr = (uchar *)calloc(40000,1);
  uncompr = (uchar *)calloc(40000,1);
  if ((compr == (uchar *)0x0) || (uncompr == (uchar *)0x0)) {
LAB_00103693:
    pcVar5 = "out of memory\n";
    goto LAB_001035fe;
  }
  check_dictionary[0] = '@';
  check_dictionary[1] = 0x9c;
  check_dictionary[2] = '\0';
  check_dictionary[3] = '\0';
  check_dictionary[4] = '\0';
  check_dictionary[5] = '\0';
  check_dictionary[6] = '\0';
  check_dictionary[7] = '\0';
  local_80a0 = (uchar *)0x9c40;
  uVar7 = zng_compress(compr,check_dictionary,"hello, hello!",0xe);
  if ((int)uVar7 != 0) {
    pcVar5 = "compress";
    goto LAB_001035ee;
  }
  builtin_memcpy(uncompr,"garbage",8);
  uVar7 = zng_uncompress(uncompr,&local_80a0,compr,check_dictionary._0_8_);
  if ((int)uVar7 != 0) {
    pcVar5 = "uncompress";
    goto LAB_001035ee;
  }
  iVar2 = strcmp((char *)uncompr,"hello, hello!");
  if (iVar2 != 0) {
    pcVar5 = "bad uncompress\n";
    goto LAB_001035fe;
  }
  printf("uncompress(): %s\n",uncompr);
  if (argc < 2) {
    pcVar5 = "foo.gz";
  }
  else {
    pcVar5 = argv[1];
  }
  lVar8 = zng_gzopen(pcVar5,"wb");
  if (lVar8 == 0) {
LAB_00103687:
    pcVar5 = "gzopen error\n";
    goto LAB_001035fe;
  }
  zng_gzputc(lVar8,0x68);
  iVar2 = zng_gzputs(lVar8,"ello");
  if (iVar2 == 4) {
    iVar2 = zng_gzprintf(lVar8,", %s!","hello");
    if (iVar2 != 8) {
      uncompr = (uchar *)zng_gzerror(lVar8,check_dictionary);
      pcVar5 = "gzprintf err: %s\n";
      goto LAB_00103828;
    }
    lVar9 = zng_gzseek(lVar8,1,1);
    if (lVar9 < 0) {
      uncompr = (uchar *)zng_gztell(lVar8);
      pcVar5 = "gzseek error, gztell=%ld\n";
      goto LAB_00103828;
    }
    iVar2 = zng_gzsetparams(lVar8,9,0);
    if (iVar2 != 0) {
      uncompr = (uchar *)zng_gzerror(lVar8,check_dictionary);
      pcVar5 = "gzsetparams err: %s\n";
      goto LAB_00103828;
    }
    lVar9 = zng_gzfwrite("hello, hello!",0xe,1,lVar8);
    if (lVar9 == 0) {
      uncompr = (uchar *)zng_gzerror(lVar8,check_dictionary);
      pcVar5 = "gzfwrite err: %s\n";
      goto LAB_00103828;
    }
    iVar2 = zng_gzflush(lVar8,2);
    if (iVar2 != 0) {
      uncompr = (uchar *)zng_gzerror(lVar8,check_dictionary);
      pcVar5 = "gzflush err: %s\n";
      goto LAB_00103828;
    }
    lVar9 = zng_gzoffset(lVar8);
    if (lVar9 < 1) {
      uncompr = (uchar *)zng_gzerror(lVar8,check_dictionary);
      pcVar5 = "gzoffset err: %s\n";
      goto LAB_00103828;
    }
    zng_gzclose(lVar8);
    piVar10 = (int *)zng_gzopen(pcVar5,"rb");
    if (piVar10 == (int *)0x0) goto LAB_00103687;
    builtin_memcpy(uncompr,"garbages",9);
    iVar2 = zng_gzread(piVar10,uncompr,40000);
    if (iVar2 != 0x1c) {
      uncompr = (uchar *)zng_gzerror(piVar10,check_dictionary);
      pcVar5 = "gzread err: %s\n";
      goto LAB_00103828;
    }
    iVar2 = strcmp((char *)uncompr,"hello, hello!");
    if (iVar2 != 0) {
      pcVar5 = "bad gzread: %s\n";
      goto LAB_00103828;
    }
    printf("gzread(): %s\n",uncompr);
    iVar2 = zng_gzeof(piVar10);
    if (iVar2 != 1) {
      pcVar5 = "gzeof err: not reporting end of stream\n";
      goto LAB_001035fe;
    }
    lVar8 = zng_gzseek(piVar10,0xffffffffffffffea,1);
    if ((lVar8 != 6) || (lVar11 = zng_gztell(piVar10), lVar11 != 6)) {
LAB_00103645:
      uVar6 = zng_gztell(piVar10);
      error("gzseek error, pos=%ld, gztell=%ld\n",lVar8,uVar6);
      uVar7 = extraout_RAX_00;
LAB_00103661:
      pcVar5 = "inflateInit";
      goto LAB_001035ee;
    }
    if (*piVar10 == 0) {
      uVar4 = zng_gzgetc(piVar10);
    }
    else {
      *piVar10 = *piVar10 + -1;
      *(long *)(piVar10 + 4) = *(long *)(piVar10 + 4) + 1;
      pbVar1 = *(byte **)(piVar10 + 2);
      *(byte **)(piVar10 + 2) = pbVar1 + 1;
      uVar4 = (uint)*pbVar1;
    }
    if (uVar4 != 0x20) {
      pcVar5 = "gzgetc error\n";
      goto LAB_001035fe;
    }
    iVar2 = zng_gzungetc(0x20,piVar10);
    if (iVar2 != 0x20) {
      pcVar5 = "gzungetc error\n";
      goto LAB_001035fe;
    }
    builtin_memcpy(uncompr,"garbages",9);
    zng_gzgets(piVar10,uncompr,40000);
    sVar12 = strlen((char *)uncompr);
    if (sVar12 != 7) {
      uncompr = (uchar *)zng_gzerror(piVar10,check_dictionary);
      pcVar5 = "gzgets err after gzseek: %s\n";
      goto LAB_00103828;
    }
    iVar2 = strcmp((char *)uncompr," hello!");
    if (iVar2 == 0) {
      printf("gzgets() after gzseek: %s\n",uncompr);
      lVar8 = zng_gzseek(piVar10,0xe,0);
      if ((lVar8 == 0xe) && (lVar11 = zng_gztell(piVar10), lVar11 == 0xe)) {
        iVar2 = zng_gzeof(piVar10);
        if (iVar2 == 0) {
          builtin_memcpy(uncompr,"garbages",9);
          zng_gzfread(uncompr,40000,1,piVar10);
          iVar2 = strcmp((char *)uncompr,"hello, hello!");
          if (iVar2 == 0) {
            printf("gzgets(): %s\n",uncompr);
            lVar8 = zng_gzoffset(piVar10);
            if ((lVar8 < 0) || (lVar8 != lVar9 + 10)) {
              pcVar5 = "gzoffset err: wrong offset at end\n";
            }
            else {
              zng_gzfread(uncompr,0xffffffffffffffff);
              zng_gzerror(piVar10,check_dictionary);
              if (check_dictionary._0_4_ == 0) {
                pcVar5 = "gzerror err: no error returned\n";
              }
              else {
                zng_gzclearerr(piVar10);
                zng_gzerror(piVar10,check_dictionary);
                if (check_dictionary._0_4_ == 0) {
                  zng_gzclose(piVar10);
                  iVar2 = zng_gzclose(0);
                  if (iVar2 == -2) {
                    check_dictionary[0x10] = '\0';
                    check_dictionary[0x11] = '\0';
                    check_dictionary[0x12] = '\0';
                    check_dictionary[0x13] = '\0';
                    check_dictionary[0x14] = '\0';
                    check_dictionary[0x15] = '\0';
                    check_dictionary[0x16] = '\0';
                    check_dictionary[0x17] = '\0';
                    check_dictionary[0x28] = '\0';
                    check_dictionary[0x29] = '\0';
                    check_dictionary[0x2a] = '\0';
                    check_dictionary[0x2b] = '\0';
                    check_dictionary[0x2c] = '\0';
                    check_dictionary[0x2d] = '\0';
                    check_dictionary[0x2e] = '\0';
                    check_dictionary[0x2f] = '\0';
                    check_dictionary[0x40] = '\0';
                    check_dictionary[0x41] = '\0';
                    check_dictionary[0x42] = '\0';
                    check_dictionary[0x43] = '\0';
                    check_dictionary[0x44] = '\0';
                    check_dictionary[0x45] = '\0';
                    check_dictionary[0x46] = '\0';
                    check_dictionary[0x47] = '\0';
                    check_dictionary[0x48] = '\0';
                    check_dictionary[0x49] = '\0';
                    check_dictionary[0x4a] = '\0';
                    check_dictionary[0x4b] = '\0';
                    check_dictionary[0x4c] = '\0';
                    check_dictionary[0x4d] = '\0';
                    check_dictionary[0x4e] = '\0';
                    check_dictionary[0x4f] = '\0';
                    check_dictionary[0x50] = '\0';
                    check_dictionary[0x51] = '\0';
                    check_dictionary[0x52] = '\0';
                    check_dictionary[0x53] = '\0';
                    check_dictionary[0x54] = '\0';
                    check_dictionary[0x55] = '\0';
                    check_dictionary[0x56] = '\0';
                    check_dictionary[0x57] = '\0';
                    uVar7 = zng_deflateInit(check_dictionary,0xffffffffffffffff);
                    if ((int)uVar7 != 0) goto LAB_00103635;
                    check_dictionary._0_8_ = hello;
                    check_dictionary._24_8_ = compr;
                    do {
                      if ((check_dictionary._16_8_ == 0xe) ||
                         (39999 < (ulong)check_dictionary._40_8_)) goto LAB_00102a4a;
                      check_dictionary[0x20] = '\x01';
                      check_dictionary[0x21] = '\0';
                      check_dictionary[0x22] = '\0';
                      check_dictionary[0x23] = '\0';
                      check_dictionary[8] = '\x01';
                      check_dictionary[9] = '\0';
                      check_dictionary[10] = '\0';
                      check_dictionary[0xb] = '\0';
                      uVar7 = zng_deflate(check_dictionary,0);
                    } while ((int)uVar7 == 0);
                    goto LAB_001035e0;
                  }
                }
                else {
                  error("gzclearerr err: not zero %d\n");
                }
                pcVar5 = "gzclose unexpected return when handle null\n";
              }
            }
          }
          else {
            pcVar5 = "bad gzgets\n";
          }
        }
        else {
          pcVar5 = "gzeof err: reporting end of stream\n";
        }
        goto LAB_001035fe;
      }
      goto LAB_00103645;
    }
  }
  else {
    uncompr = (uchar *)zng_gzerror(lVar8,check_dictionary);
    pcVar5 = "gzputs err: %s\n";
LAB_00103828:
    error(pcVar5,uncompr);
  }
  pcVar5 = "bad gzgets after gzseek\n";
  goto LAB_001035fe;
LAB_00102a4a:
  do {
    check_dictionary[0x20] = '\x01';
    check_dictionary[0x21] = '\0';
    check_dictionary[0x22] = '\0';
    check_dictionary[0x23] = '\0';
    uVar7 = zng_deflate(check_dictionary,4);
  } while ((int)uVar7 == 0);
  if ((int)uVar7 != 1) goto LAB_001035e0;
  uVar7 = zng_deflateEnd(check_dictionary);
  if ((int)uVar7 != 0) goto LAB_00103615;
  check_dictionary[0x40] = '\0';
  check_dictionary[0x41] = '\0';
  check_dictionary[0x42] = '\0';
  check_dictionary[0x43] = '\0';
  check_dictionary[0x44] = '\0';
  check_dictionary[0x45] = '\0';
  check_dictionary[0x46] = '\0';
  check_dictionary[0x47] = '\0';
  check_dictionary[0x48] = '\0';
  check_dictionary[0x49] = '\0';
  check_dictionary[0x4a] = '\0';
  check_dictionary[0x4b] = '\0';
  check_dictionary[0x4c] = '\0';
  check_dictionary[0x4d] = '\0';
  check_dictionary[0x4e] = '\0';
  check_dictionary[0x4f] = '\0';
  check_dictionary[0x50] = '\0';
  check_dictionary[0x51] = '\0';
  check_dictionary[0x52] = '\0';
  check_dictionary[0x53] = '\0';
  check_dictionary[0x54] = '\0';
  check_dictionary[0x55] = '\0';
  check_dictionary[0x56] = '\0';
  check_dictionary[0x57] = '\0';
  check_dictionary._8_8_ = check_dictionary._8_8_ & 0xffffffff00000000;
  check_dictionary[0x10] = '\0';
  check_dictionary[0x11] = '\0';
  check_dictionary[0x12] = '\0';
  check_dictionary[0x13] = '\0';
  check_dictionary[0x14] = '\0';
  check_dictionary[0x15] = '\0';
  check_dictionary[0x16] = '\0';
  check_dictionary[0x17] = '\0';
  builtin_memcpy(uncompr,"garbage",8);
  check_dictionary[0x28] = '\0';
  check_dictionary[0x29] = '\0';
  check_dictionary[0x2a] = '\0';
  check_dictionary[0x2b] = '\0';
  check_dictionary[0x2c] = '\0';
  check_dictionary[0x2d] = '\0';
  check_dictionary[0x2e] = '\0';
  check_dictionary[0x2f] = '\0';
  check_dictionary._0_8_ = compr;
  check_dictionary._24_8_ = uncompr;
  uVar7 = zng_inflateInit();
  if ((int)uVar7 != 0) goto LAB_00103661;
  do {
    iVar2 = (int)in_R8;
    if ((39999 < (ulong)check_dictionary._40_8_) || (39999 < (ulong)check_dictionary._16_8_))
    goto LAB_00102af6;
    check_dictionary[0x20] = '\x01';
    check_dictionary[0x21] = '\0';
    check_dictionary[0x22] = '\0';
    check_dictionary[0x23] = '\0';
    check_dictionary[8] = '\x01';
    check_dictionary[9] = '\0';
    check_dictionary[10] = '\0';
    check_dictionary[0xb] = '\0';
    uVar7 = zng_inflate(check_dictionary,0);
    iVar2 = (int)in_R8;
  } while ((int)uVar7 == 0);
  if ((int)uVar7 != 1) goto LAB_00103605;
LAB_00102af6:
  uVar7 = zng_inflateEnd(check_dictionary);
  if ((int)uVar7 != 0) {
LAB_00103674:
    pcVar5 = "inflateEnd";
    goto LAB_001035ee;
  }
  iVar3 = strcmp((char *)uncompr,"hello, hello!");
  if (iVar3 != 0) {
    pcVar5 = "bad inflate\n";
    goto LAB_001035fe;
  }
  printf("inflate(): %s\n",uncompr);
  sVar14 = 0;
  test_large_deflate(compr,40000,uncompr,0,iVar2);
  test_large_inflate(compr,40000,uncompr,sVar14);
  sVar14 = 1;
  test_large_deflate(compr,40000,uncompr,1,iVar2);
  test_large_inflate(compr,40000,uncompr,sVar14);
  check_dictionary[0x40] = '\0';
  check_dictionary[0x41] = '\0';
  check_dictionary[0x42] = '\0';
  check_dictionary[0x43] = '\0';
  check_dictionary[0x44] = '\0';
  check_dictionary[0x45] = '\0';
  check_dictionary[0x46] = '\0';
  check_dictionary[0x47] = '\0';
  check_dictionary[0x48] = '\0';
  check_dictionary[0x49] = '\0';
  check_dictionary[0x4a] = '\0';
  check_dictionary[0x4b] = '\0';
  check_dictionary[0x4c] = '\0';
  check_dictionary[0x4d] = '\0';
  check_dictionary[0x4e] = '\0';
  check_dictionary[0x4f] = '\0';
  check_dictionary[0x50] = '\0';
  check_dictionary[0x51] = '\0';
  check_dictionary[0x52] = '\0';
  check_dictionary[0x53] = '\0';
  check_dictionary[0x54] = '\0';
  check_dictionary[0x55] = '\0';
  check_dictionary[0x56] = '\0';
  check_dictionary[0x57] = '\0';
  uVar7 = zng_deflateInit(check_dictionary,0xffffffffffffffff);
  if ((int)uVar7 != 0) goto LAB_00103635;
  check_dictionary._0_8_ = hello;
  check_dictionary[8] = '\x03';
  check_dictionary[9] = '\0';
  check_dictionary[10] = '\0';
  check_dictionary[0xb] = '\0';
  check_dictionary[0x20] = '@';
  check_dictionary[0x21] = 0x9c;
  check_dictionary[0x22] = '\0';
  check_dictionary[0x23] = '\0';
  check_dictionary._24_8_ = compr;
  uVar7 = zng_deflate(check_dictionary,3);
  if ((int)uVar7 != 0) goto LAB_001035e0;
  compr[3] = compr[3] + '\x01';
  check_dictionary[8] = '\v';
  check_dictionary[9] = '\0';
  check_dictionary[10] = '\0';
  check_dictionary[0xb] = '\0';
  uVar7 = zng_deflate(check_dictionary,4);
  if (1 < (uint)uVar7) goto LAB_001035e0;
  uVar7 = zng_deflateEnd(check_dictionary);
  uVar6 = check_dictionary._40_8_;
  if ((int)uVar7 != 0) goto LAB_00103615;
  builtin_memcpy(uncompr,"garbage",8);
  check_dictionary[0x50] = '\0';
  check_dictionary[0x51] = '\0';
  check_dictionary[0x52] = '\0';
  check_dictionary[0x53] = '\0';
  check_dictionary[0x54] = '\0';
  check_dictionary[0x55] = '\0';
  check_dictionary[0x56] = '\0';
  check_dictionary[0x57] = '\0';
  check_dictionary[0x40] = '\0';
  check_dictionary[0x41] = '\0';
  check_dictionary[0x42] = '\0';
  check_dictionary[0x43] = '\0';
  check_dictionary[0x44] = '\0';
  check_dictionary[0x45] = '\0';
  check_dictionary[0x46] = '\0';
  check_dictionary[0x47] = '\0';
  check_dictionary[0x48] = '\0';
  check_dictionary[0x49] = '\0';
  check_dictionary[0x4a] = '\0';
  check_dictionary[0x4b] = '\0';
  check_dictionary[0x4c] = '\0';
  check_dictionary[0x4d] = '\0';
  check_dictionary[0x4e] = '\0';
  check_dictionary[0x4f] = '\0';
  check_dictionary[8] = '\x02';
  check_dictionary[9] = '\0';
  check_dictionary[10] = '\0';
  check_dictionary[0xb] = '\0';
  check_dictionary._0_8_ = compr;
  uVar7 = zng_inflateInit();
  if ((int)uVar7 != 0) goto LAB_00103661;
  check_dictionary[0x20] = '@';
  check_dictionary[0x21] = 0x9c;
  check_dictionary[0x22] = '\0';
  check_dictionary[0x23] = '\0';
  check_dictionary._24_8_ = uncompr;
  uVar7 = zng_inflate(check_dictionary,0);
  if ((int)uVar7 != 0) goto LAB_00103605;
  check_dictionary._8_4_ = (int)uVar6 + -2;
  uVar7 = zng_inflateSync();
  if ((int)uVar7 != 0) {
    pcVar5 = "inflateSync";
    goto LAB_001035ee;
  }
  iVar2 = zng_inflate(check_dictionary,4);
  if (iVar2 != 1) {
    pcVar5 = "inflate should report Z_STREAM_END\n";
    goto LAB_001035fe;
  }
  uVar7 = zng_inflateEnd(check_dictionary);
  if ((int)uVar7 != 0) goto LAB_00103674;
  printf("after inflateSync(): hel%s\n",uncompr);
  check_dictionary._88_8_ = check_dictionary._88_8_ & 0xffffffff;
  check_dictionary[0x40] = '\0';
  check_dictionary[0x41] = '\0';
  check_dictionary[0x42] = '\0';
  check_dictionary[0x43] = '\0';
  check_dictionary[0x44] = '\0';
  check_dictionary[0x45] = '\0';
  check_dictionary[0x46] = '\0';
  check_dictionary[0x47] = '\0';
  check_dictionary[0x48] = '\0';
  check_dictionary[0x49] = '\0';
  check_dictionary[0x4a] = '\0';
  check_dictionary[0x4b] = '\0';
  check_dictionary[0x4c] = '\0';
  check_dictionary[0x4d] = '\0';
  check_dictionary[0x4e] = '\0';
  check_dictionary[0x4f] = '\0';
  check_dictionary[0x50] = '\0';
  check_dictionary[0x51] = '\0';
  check_dictionary[0x52] = '\0';
  check_dictionary[0x53] = '\0';
  check_dictionary[0x54] = '\0';
  check_dictionary[0x55] = '\0';
  check_dictionary[0x56] = '\0';
  check_dictionary[0x57] = '\0';
  uVar7 = zng_deflateInit(check_dictionary,9);
  if ((int)uVar7 != 0) goto LAB_00103635;
  uVar7 = zng_deflateSetDictionary(check_dictionary,"hello",6);
  if ((int)uVar7 != 0) {
    pcVar5 = "deflateSetDictionary";
    goto LAB_001035ee;
  }
  dictId = (ulong)check_dictionary._88_8_ >> 0x20;
  check_dictionary[0x20] = '@';
  check_dictionary[0x21] = 0x9c;
  check_dictionary[0x22] = '\0';
  check_dictionary[0x23] = '\0';
  check_dictionary._0_8_ = hello;
  check_dictionary[8] = '\x0e';
  check_dictionary[9] = '\0';
  check_dictionary[10] = '\0';
  check_dictionary[0xb] = '\0';
  check_dictionary._24_8_ = compr;
  iVar2 = zng_deflate(check_dictionary,4);
  if (iVar2 == 1) {
    uVar7 = zng_deflateEnd(check_dictionary);
    if ((int)uVar7 != 0) goto LAB_00103615;
    check_dictionary_len = 0;
    builtin_memcpy(uncompr,"garbage garbage garbage",0x18);
    local_8044 = 0;
    local_8050 = 0;
    local_8060 = 0;
    uStack_8058 = 0;
    local_8098[0] = '@';
    local_8098[1] = 0x9c;
    local_8098[2] = '\0';
    local_8098[3] = '\0';
    local_80a0 = compr;
    uVar7 = zng_inflateInit();
    if ((int)uVar7 == 0) {
      local_8080 = 40000;
      local_8088 = uncompr;
      do {
        uVar7 = zng_inflate(&local_80a0,0);
        if ((int)uVar7 == 2) {
          if (dictId != local_8044) goto LAB_001035f7;
          uVar7 = zng_inflateSetDictionary(&local_80a0,"hello",6);
        }
        else if ((int)uVar7 == 1) {
          uVar7 = zng_inflateGetDictionary(&local_80a0,0,&check_dictionary_len);
          if ((int)uVar7 == 0) {
            if (check_dictionary_len < 6) {
              pcVar5 = "bad dictionary length\n";
              goto LAB_001035fe;
            }
            uVar7 = zng_inflateGetDictionary(&local_80a0,check_dictionary,&check_dictionary_len);
            if ((int)uVar7 == 0) {
              iVar2 = bcmp("hello",check_dictionary,6);
              if (iVar2 != 0) {
                pcVar5 = "bad dictionary\n";
                goto LAB_001035fe;
              }
              uVar7 = zng_inflateEnd(&local_80a0);
              if ((int)uVar7 != 0) goto LAB_00103674;
              iVar2 = strncmp((char *)uncompr,"hello, hello!",0xe);
              if (iVar2 != 0) {
                pcVar5 = "bad inflate with dict\n";
                goto LAB_001035fe;
              }
              printf("inflate with dictionary: %s\n",uncompr);
              check_dictionary[0x40] = '\0';
              check_dictionary[0x41] = '\0';
              check_dictionary[0x42] = '\0';
              check_dictionary[0x43] = '\0';
              check_dictionary[0x44] = '\0';
              check_dictionary[0x45] = '\0';
              check_dictionary[0x46] = '\0';
              check_dictionary[0x47] = '\0';
              check_dictionary[0x48] = '\0';
              check_dictionary[0x49] = '\0';
              check_dictionary[0x4a] = '\0';
              check_dictionary[0x4b] = '\0';
              check_dictionary[0x4c] = '\0';
              check_dictionary[0x4d] = '\0';
              check_dictionary[0x4e] = '\0';
              check_dictionary[0x4f] = '\0';
              check_dictionary[0x50] = '\0';
              check_dictionary[0x51] = '\0';
              check_dictionary[0x52] = '\0';
              check_dictionary[0x53] = '\0';
              check_dictionary[0x54] = '\0';
              check_dictionary[0x55] = '\0';
              check_dictionary[0x56] = '\0';
              check_dictionary[0x57] = '\0';
              check_dictionary[8] = '\x0e';
              check_dictionary[9] = '\0';
              check_dictionary[10] = '\0';
              check_dictionary[0xb] = '\0';
              check_dictionary._0_8_ = hello;
              check_dictionary._32_8_ = check_dictionary._32_8_ & 0xffffffff00000000;
              check_dictionary[0x18] = '\0';
              check_dictionary[0x19] = '\0';
              check_dictionary[0x1a] = '\0';
              check_dictionary[0x1b] = '\0';
              check_dictionary[0x1c] = '\0';
              check_dictionary[0x1d] = '\0';
              check_dictionary[0x1e] = '\0';
              check_dictionary[0x1f] = '\0';
              uVar7 = zng_deflateInit(check_dictionary,0xffffffffffffffff);
              if ((int)uVar7 != 0) goto LAB_00103635;
              iVar2 = zng_deflateBound(check_dictionary,0xe);
              pvVar13 = malloc((long)iVar2);
              if (pvVar13 != (void *)0x0) {
                check_dictionary[0x20] = (char)iVar2;
                check_dictionary[0x21] = (char)((uint)iVar2 >> 8);
                check_dictionary[0x22] = (char)((uint)iVar2 >> 0x10);
                check_dictionary[0x23] = (char)((uint)iVar2 >> 0x18);
                check_dictionary._24_8_ = pvVar13;
                uVar7 = zng_deflate(check_dictionary,4);
                if ((int)uVar7 != 0) {
                  if ((int)uVar7 != 1) goto LAB_001035e0;
                  puts("deflateBound(): OK");
                }
              }
              uVar7 = zng_deflateEnd(check_dictionary);
              if ((int)uVar7 != 0) goto LAB_00103615;
              free(pvVar13);
              check_dictionary[0] = '\0';
              check_dictionary[1] = '\0';
              check_dictionary[2] = '\0';
              check_dictionary[3] = '\0';
              check_dictionary[4] = '\0';
              check_dictionary[5] = '\0';
              check_dictionary[6] = '\0';
              check_dictionary[7] = '\0';
              check_dictionary[8] = '\0';
              check_dictionary[9] = '\0';
              check_dictionary[10] = '\0';
              check_dictionary[0xb] = '\0';
              check_dictionary[0xc] = '\0';
              check_dictionary[0xd] = '\0';
              check_dictionary[0xe] = '\0';
              check_dictionary[0xf] = '\0';
              check_dictionary[0x10] = '\0';
              check_dictionary[0x11] = '\0';
              check_dictionary[0x12] = '\0';
              check_dictionary[0x13] = '\0';
              check_dictionary[0x14] = '\0';
              check_dictionary[0x15] = '\0';
              check_dictionary[0x16] = '\0';
              check_dictionary[0x17] = '\0';
              check_dictionary[0x18] = '\0';
              check_dictionary[0x19] = '\0';
              check_dictionary[0x1a] = '\0';
              check_dictionary[0x1b] = '\0';
              check_dictionary[0x1c] = '\0';
              check_dictionary[0x1d] = '\0';
              check_dictionary[0x1e] = '\0';
              check_dictionary[0x1f] = '\0';
              check_dictionary[0x20] = '\0';
              check_dictionary[0x21] = '\0';
              check_dictionary[0x22] = '\0';
              check_dictionary[0x23] = '\0';
              check_dictionary[0x24] = '\0';
              check_dictionary[0x25] = '\0';
              check_dictionary[0x26] = '\0';
              check_dictionary[0x27] = '\0';
              check_dictionary[0x28] = '\0';
              check_dictionary[0x29] = '\0';
              check_dictionary[0x2a] = '\0';
              check_dictionary[0x2b] = '\0';
              check_dictionary[0x2c] = '\0';
              check_dictionary[0x2d] = '\0';
              check_dictionary[0x2e] = '\0';
              check_dictionary[0x2f] = '\0';
              check_dictionary[0x30] = '\0';
              check_dictionary[0x31] = '\0';
              check_dictionary[0x32] = '\0';
              check_dictionary[0x33] = '\0';
              check_dictionary[0x34] = '\0';
              check_dictionary[0x35] = '\0';
              check_dictionary[0x36] = '\0';
              check_dictionary[0x37] = '\0';
              check_dictionary[0x38] = '\0';
              check_dictionary[0x39] = '\0';
              check_dictionary[0x3a] = '\0';
              check_dictionary[0x3b] = '\0';
              check_dictionary[0x3c] = '\0';
              check_dictionary[0x3d] = '\0';
              check_dictionary[0x3e] = '\0';
              check_dictionary[0x3f] = '\0';
              check_dictionary[0x40] = '\0';
              check_dictionary[0x41] = '\0';
              check_dictionary[0x42] = '\0';
              check_dictionary[0x43] = '\0';
              check_dictionary[0x44] = '\0';
              check_dictionary[0x45] = '\0';
              check_dictionary[0x46] = '\0';
              check_dictionary[0x47] = '\0';
              check_dictionary[0x48] = '\0';
              check_dictionary[0x49] = '\0';
              check_dictionary[0x4a] = '\0';
              check_dictionary[0x4b] = '\0';
              check_dictionary[0x4c] = '\0';
              check_dictionary[0x4d] = '\0';
              check_dictionary[0x4e] = '\0';
              check_dictionary[0x4f] = '\0';
              check_dictionary[0x50] = '\0';
              check_dictionary[0x51] = '\0';
              check_dictionary[0x52] = '\0';
              check_dictionary[0x53] = '\0';
              check_dictionary[0x54] = '\0';
              check_dictionary[0x55] = '\0';
              check_dictionary[0x56] = '\0';
              check_dictionary[0x57] = '\0';
              check_dictionary[0x58] = '\0';
              check_dictionary[0x59] = '\0';
              check_dictionary[0x5a] = '\0';
              check_dictionary[0x5b] = '\0';
              check_dictionary[0x5c] = '\0';
              check_dictionary[0x5d] = '\0';
              check_dictionary[0x5e] = '\0';
              check_dictionary[0x5f] = '\0';
              check_dictionary[0x60] = '\0';
              check_dictionary[0x61] = '\0';
              check_dictionary[0x62] = '\0';
              check_dictionary[99] = '\0';
              check_dictionary[100] = '\0';
              check_dictionary[0x65] = '\0';
              check_dictionary[0x66] = '\0';
              check_dictionary[0x67] = '\0';
              uVar7 = zng_deflateInit(check_dictionary,0xffffffffffffffff);
              if ((int)uVar7 != 0) goto LAB_00103635;
              check_dictionary._0_8_ = hello;
              check_dictionary._24_8_ = compr;
              goto LAB_00102f40;
            }
          }
          pcVar5 = "inflateGetDictionary";
          goto LAB_001035ee;
        }
        if ((int)uVar7 != 0) {
          pcVar5 = "inflate with dict";
          goto LAB_001035ee;
        }
      } while( true );
    }
    goto LAB_00103661;
  }
LAB_0010369f:
  pcVar5 = "deflate should report Z_STREAM_END\n";
LAB_001035fe:
  do {
    error(pcVar5);
    uVar7 = extraout_RAX;
LAB_00103605:
    pcVar5 = "inflate";
LAB_001035ee:
    error("%s error: %d\n",pcVar5,uVar7 & 0xffffffff);
LAB_001035f7:
    pcVar5 = "unexpected dictionary";
  } while( true );
  while( true ) {
    check_dictionary[0x20] = '\x01';
    check_dictionary[0x21] = '\0';
    check_dictionary[0x22] = '\0';
    check_dictionary[0x23] = '\0';
    check_dictionary[8] = '\x01';
    check_dictionary[9] = '\0';
    check_dictionary[10] = '\0';
    check_dictionary[0xb] = '\0';
    uVar7 = zng_deflate(check_dictionary,0);
    if ((int)uVar7 != 0) break;
LAB_00102f40:
    if ((check_dictionary._16_8_ == 0xe) || (39999 < (ulong)check_dictionary._40_8_))
    goto LAB_00102f77;
  }
LAB_001035e0:
  pcVar5 = "deflate";
  goto LAB_001035ee;
LAB_00102f77:
  do {
    check_dictionary[0x20] = '\x01';
    check_dictionary[0x21] = '\0';
    check_dictionary[0x22] = '\0';
    check_dictionary[0x23] = '\0';
    uVar7 = zng_deflate(check_dictionary,4);
  } while ((int)uVar7 == 0);
  if ((int)uVar7 != 1) goto LAB_001035e0;
  uVar7 = zng_deflateCopy(&local_80a0,check_dictionary);
  if ((int)uVar7 != 0) {
    pcVar5 = "deflate_copy";
    goto LAB_001035ee;
  }
  if (*(int *)(check_dictionary._56_8_ + 0x30) == *(int *)(local_8068 + 0x30)) {
    puts("deflate_copy(): OK");
  }
  uVar7 = zng_deflateEnd(check_dictionary);
  if ((int)uVar7 != 0) {
    pcVar5 = "deflateEnd original";
    goto LAB_001035ee;
  }
  uVar7 = zng_deflateEnd(&local_80a0);
  if ((int)uVar7 != 0) {
    pcVar5 = "deflateEnd copy";
    goto LAB_001035ee;
  }
  check_dictionary[0x40] = '\0';
  check_dictionary[0x41] = '\0';
  check_dictionary[0x42] = '\0';
  check_dictionary[0x43] = '\0';
  check_dictionary[0x44] = '\0';
  check_dictionary[0x45] = '\0';
  check_dictionary[0x46] = '\0';
  check_dictionary[0x47] = '\0';
  check_dictionary[0x48] = '\0';
  check_dictionary[0x49] = '\0';
  check_dictionary[0x4a] = '\0';
  check_dictionary[0x4b] = '\0';
  check_dictionary[0x4c] = '\0';
  check_dictionary[0x4d] = '\0';
  check_dictionary[0x4e] = '\0';
  check_dictionary[0x4f] = '\0';
  check_dictionary[0x50] = '\0';
  check_dictionary[0x51] = '\0';
  check_dictionary[0x52] = '\0';
  check_dictionary[0x53] = '\0';
  check_dictionary[0x54] = '\0';
  check_dictionary[0x55] = '\0';
  check_dictionary[0x56] = '\0';
  check_dictionary[0x57] = '\0';
  uVar7 = zng_deflateInit(check_dictionary,9);
  if ((int)uVar7 != 0) {
LAB_00103635:
    pcVar5 = "deflateInit";
    goto LAB_001035ee;
  }
  check_dictionary[0x20] = '@';
  check_dictionary[0x21] = 0x9c;
  check_dictionary[0x22] = '\0';
  check_dictionary[0x23] = '\0';
  check_dictionary._0_8_ = hello;
  check_dictionary[8] = '\x0e';
  check_dictionary[9] = '\0';
  check_dictionary[10] = '\0';
  check_dictionary[0xb] = '\0';
  check_dictionary._24_8_ = compr;
  iVar2 = zng_deflate(check_dictionary,4);
  if (iVar2 == 1) {
    pvVar13 = calloc(0x100,1);
    __ptr = calloc(4,1);
    uVar7 = zng_deflateGetDictionary(check_dictionary,pvVar13,__ptr);
    if ((int)uVar7 != 0) {
      pcVar5 = "deflateGetDictionary";
      goto LAB_001035ee;
    }
    printf("deflateGetDictionary(): %s\n",pvVar13);
    uVar7 = zng_deflateEnd(check_dictionary);
    if ((int)uVar7 != 0) goto LAB_00103615;
    free(pvVar13);
    free(__ptr);
    __ptr_00 = (undefined4 *)calloc(1,0x50);
    if (__ptr_00 != (undefined4 *)0x0) {
      check_dictionary[0x40] = '\0';
      check_dictionary[0x41] = '\0';
      check_dictionary[0x42] = '\0';
      check_dictionary[0x43] = '\0';
      check_dictionary[0x44] = '\0';
      check_dictionary[0x45] = '\0';
      check_dictionary[0x46] = '\0';
      check_dictionary[0x47] = '\0';
      check_dictionary[0x48] = '\0';
      check_dictionary[0x49] = '\0';
      check_dictionary[0x4a] = '\0';
      check_dictionary[0x4b] = '\0';
      check_dictionary[0x4c] = '\0';
      check_dictionary[0x4d] = '\0';
      check_dictionary[0x4e] = '\0';
      check_dictionary[0x4f] = '\0';
      check_dictionary[0x50] = '\0';
      check_dictionary[0x51] = '\0';
      check_dictionary[0x52] = '\0';
      check_dictionary[0x53] = '\0';
      check_dictionary[0x54] = '\0';
      check_dictionary[0x55] = '\0';
      check_dictionary[0x56] = '\0';
      check_dictionary[0x57] = '\0';
      uVar7 = zng_deflateInit2(check_dictionary,0xffffffffffffffff,8,0x1f,8,0);
      if ((int)uVar7 != 0) {
LAB_001036be:
        pcVar5 = "deflateInit2";
        goto LAB_001035ee;
      }
      *__ptr_00 = 1;
      *(char **)(__ptr_00 + 0xe) = "comment";
      *(char **)(__ptr_00 + 10) = "name";
      __ptr_00[0x11] = 1;
      *(char **)(__ptr_00 + 6) = "extra";
      __ptr_00[8] = 5;
      uVar7 = zng_deflateSetHeader(check_dictionary,__ptr_00);
      if ((int)uVar7 != 0) {
        pcVar5 = "deflateSetHeader";
        goto LAB_001035ee;
      }
      puts("deflateSetHeader(): OK");
      zng_deflateBound(check_dictionary,40000);
      check_dictionary._0_8_ = hello;
      check_dictionary._24_8_ = compr;
      do {
        if ((check_dictionary._16_8_ == 0xe) || (39999 < (ulong)check_dictionary._40_8_))
        goto LAB_001031a0;
        check_dictionary[0x20] = '\x01';
        check_dictionary[0x21] = '\0';
        check_dictionary[0x22] = '\0';
        check_dictionary[0x23] = '\0';
        check_dictionary[8] = '\x01';
        check_dictionary[9] = '\0';
        check_dictionary[10] = '\0';
        check_dictionary[0xb] = '\0';
        uVar7 = zng_deflate(check_dictionary,0);
      } while ((int)uVar7 == 0);
      goto LAB_001035e0;
    }
    goto LAB_00103693;
  }
  goto LAB_0010369f;
LAB_001031a0:
  do {
    check_dictionary[0x20] = '\x01';
    check_dictionary[0x21] = '\0';
    check_dictionary[0x22] = '\0';
    check_dictionary[0x23] = '\0';
    uVar7 = zng_deflate(check_dictionary,4);
  } while ((int)uVar7 == 0);
  if ((int)uVar7 == 1) {
    uVar7 = zng_deflateEnd(check_dictionary);
    if ((int)uVar7 != 0) goto LAB_00103615;
    free(__ptr_00);
    check_dictionary[0x40] = '\0';
    check_dictionary[0x41] = '\0';
    check_dictionary[0x42] = '\0';
    check_dictionary[0x43] = '\0';
    check_dictionary[0x44] = '\0';
    check_dictionary[0x45] = '\0';
    check_dictionary[0x46] = '\0';
    check_dictionary[0x47] = '\0';
    check_dictionary[0x48] = '\0';
    check_dictionary[0x49] = '\0';
    check_dictionary[0x4a] = '\0';
    check_dictionary[0x4b] = '\0';
    check_dictionary[0x4c] = '\0';
    check_dictionary[0x4d] = '\0';
    check_dictionary[0x4e] = '\0';
    check_dictionary[0x4f] = '\0';
    check_dictionary[0x50] = '\0';
    check_dictionary[0x51] = '\0';
    check_dictionary[0x52] = '\0';
    check_dictionary[0x53] = '\0';
    check_dictionary[0x54] = '\0';
    check_dictionary[0x55] = '\0';
    check_dictionary[0x56] = '\0';
    check_dictionary[0x57] = '\0';
    uVar7 = zng_deflateInit(check_dictionary,9);
    if ((int)uVar7 != 0) goto LAB_00103635;
    uVar7 = zng_deflateTune(check_dictionary,3,5,0x12,6);
    if ((int)uVar7 != 0) {
      pcVar5 = "deflateTune";
      goto LAB_001035ee;
    }
    puts("deflateTune(): OK");
    check_dictionary._0_8_ = hello;
    check_dictionary._24_8_ = compr;
    do {
      if ((check_dictionary._16_8_ == 0xe) || (39999 < (ulong)check_dictionary._40_8_))
      goto LAB_00103271;
      check_dictionary[0x20] = '\x01';
      check_dictionary[0x21] = '\0';
      check_dictionary[0x22] = '\0';
      check_dictionary[0x23] = '\0';
      check_dictionary[8] = '\x01';
      check_dictionary[9] = '\0';
      check_dictionary[10] = '\0';
      check_dictionary[0xb] = '\0';
      uVar7 = zng_deflate(check_dictionary,0);
    } while ((int)uVar7 == 0);
  }
  goto LAB_001035e0;
LAB_00103271:
  do {
    check_dictionary[0x20] = '\x01';
    check_dictionary[0x21] = '\0';
    check_dictionary[0x22] = '\0';
    check_dictionary[0x23] = '\0';
    uVar7 = zng_deflate(check_dictionary,4);
  } while ((int)uVar7 == 0);
  if ((int)uVar7 == 1) {
    uVar7 = zng_deflateEnd(check_dictionary);
    if ((int)uVar7 != 0) {
LAB_00103615:
      pcVar5 = "deflateEnd";
      goto LAB_001035ee;
    }
    __ptr_01 = (uint *)calloc(0x100,1);
    pvVar13 = calloc(0x100,1);
    check_dictionary[0x40] = '\0';
    check_dictionary[0x41] = '\0';
    check_dictionary[0x42] = '\0';
    check_dictionary[0x43] = '\0';
    check_dictionary[0x44] = '\0';
    check_dictionary[0x45] = '\0';
    check_dictionary[0x46] = '\0';
    check_dictionary[0x47] = '\0';
    check_dictionary[0x48] = '\0';
    check_dictionary[0x49] = '\0';
    check_dictionary[0x4a] = '\0';
    check_dictionary[0x4b] = '\0';
    check_dictionary[0x4c] = '\0';
    check_dictionary[0x4d] = '\0';
    check_dictionary[0x4e] = '\0';
    check_dictionary[0x4f] = '\0';
    check_dictionary[0x50] = '\0';
    check_dictionary[0x51] = '\0';
    check_dictionary[0x52] = '\0';
    check_dictionary[0x53] = '\0';
    check_dictionary[0x54] = '\0';
    check_dictionary[0x55] = '\0';
    check_dictionary[0x56] = '\0';
    check_dictionary[0x57] = '\0';
    uVar7 = zng_deflateInit(check_dictionary,0xffffffffffffffff);
    if ((int)uVar7 != 0) goto LAB_00103635;
    check_dictionary._0_8_ = hello;
    check_dictionary._24_8_ = compr;
    do {
      if ((check_dictionary._16_8_ == 0xe) || (39999 < (ulong)check_dictionary._40_8_)) {
        uVar7 = zng_deflatePending(check_dictionary,pvVar13,__ptr_01);
        if ((int)uVar7 != 0) {
          pcVar5 = "deflatePending";
          goto LAB_001035ee;
        }
        pcVar5 = "deflatePending(): error";
        if (*__ptr_01 < 8) {
          pcVar5 = "deflatePending(): OK";
        }
        puts(pcVar5);
        do {
          check_dictionary[0x20] = '\x01';
          check_dictionary[0x21] = '\0';
          check_dictionary[0x22] = '\0';
          check_dictionary[0x23] = '\0';
          uVar7 = zng_deflate(check_dictionary,4);
        } while ((int)uVar7 == 0);
        if ((int)uVar7 != 1) break;
        uVar7 = zng_deflateEnd(check_dictionary);
        if ((int)uVar7 != 0) goto LAB_00103615;
        free(__ptr_01);
        free(pvVar13);
        check_dictionary[0x40] = '\0';
        check_dictionary[0x41] = '\0';
        check_dictionary[0x42] = '\0';
        check_dictionary[0x43] = '\0';
        check_dictionary[0x44] = '\0';
        check_dictionary[0x45] = '\0';
        check_dictionary[0x46] = '\0';
        check_dictionary[0x47] = '\0';
        check_dictionary[0x48] = '\0';
        check_dictionary[0x49] = '\0';
        check_dictionary[0x4a] = '\0';
        check_dictionary[0x4b] = '\0';
        check_dictionary[0x4c] = '\0';
        check_dictionary[0x4d] = '\0';
        check_dictionary[0x4e] = '\0';
        check_dictionary[0x4f] = '\0';
        check_dictionary[0x50] = '\0';
        check_dictionary[0x51] = '\0';
        check_dictionary[0x52] = '\0';
        check_dictionary[0x53] = '\0';
        check_dictionary[0x54] = '\0';
        check_dictionary[0x55] = '\0';
        check_dictionary[0x56] = '\0';
        check_dictionary[0x57] = '\0';
        uVar7 = zng_deflateInit2(check_dictionary,0xffffffffffffffff,8,0xfffffffffffffff1,8,0);
        if ((int)uVar7 != 0) goto LAB_001036be;
        uVar7 = zng_deflatePrime(check_dictionary,0x10,0x8b1f);
        if (((((int)uVar7 != 0) || (uVar7 = zng_deflatePrime(check_dictionary,8), (int)uVar7 != 0))
            || (uVar7 = zng_deflatePrime(check_dictionary,3,0), (int)uVar7 != 0)) ||
           (uVar7 = zng_deflatePrime(check_dictionary,5,0), (int)uVar7 != 0)) {
LAB_00103625:
          pcVar5 = "deflatePrime";
          goto LAB_001035ee;
        }
        uVar4 = deflate_prime_32((zng_stream *)check_dictionary,0);
        uVar7 = (ulong)uVar4;
        if (((uVar4 != 0) || (uVar7 = zng_deflatePrime(check_dictionary,8,0), (int)uVar7 != 0)) ||
           (uVar7 = zng_deflatePrime(check_dictionary,8,0xff), (int)uVar7 != 0)) goto LAB_00103625;
        check_dictionary._0_8_ = hello;
        check_dictionary[8] = '\x0e';
        check_dictionary[9] = '\0';
        check_dictionary[10] = '\0';
        check_dictionary[0xb] = '\0';
        check_dictionary[0x20] = '@';
        check_dictionary[0x21] = 0x9c;
        check_dictionary[0x22] = '\0';
        check_dictionary[0x23] = '\0';
        check_dictionary._24_8_ = compr;
        uVar7 = zng_deflate(check_dictionary,4);
        if (1 < (uint)uVar7) break;
        value = zng_crc32(0,"hello, hello!",0xe);
        uVar4 = deflate_prime_32((zng_stream *)check_dictionary,value);
        uVar7 = (ulong)uVar4;
        if (uVar4 != 0) goto LAB_00103625;
        uVar4 = deflate_prime_32((zng_stream *)check_dictionary,0xe);
        uVar7 = (ulong)uVar4;
        if (uVar4 != 0) goto LAB_00103625;
        uVar7 = zng_deflateEnd(check_dictionary);
        uVar6 = check_dictionary._40_8_;
        if ((int)uVar7 != 0) goto LAB_00103615;
        local_8060 = 0;
        uStack_8058 = 0;
        local_8050 = 0;
        local_8098[0] = check_dictionary[0x28];
        local_8098[1] = check_dictionary[0x29];
        local_8098[2] = check_dictionary[0x2a];
        local_8098[3] = check_dictionary[0x2b];
        local_8080 = 40000;
        local_8090 = 0;
        local_8078 = 0;
        local_80a0 = compr;
        local_8088 = uncompr;
        check_dictionary._40_8_ = uVar6;
        uVar7 = zng_inflateInit2(&local_80a0,0x2f);
        if ((int)uVar7 != 0) goto LAB_00103661;
        uVar7 = zng_inflate(&local_80a0,4);
        if (((int)uVar7 != -5) && ((int)uVar7 != 0)) goto LAB_00103605;
        uVar7 = zng_inflateEnd(&local_80a0);
        if ((int)uVar7 != 0) goto LAB_00103674;
        iVar2 = strcmp((char *)uncompr,"hello, hello!");
        if (iVar2 == 0) {
          puts("deflatePrime(): OK");
          free(compr);
          free(uncompr);
          return 0;
        }
        pcVar5 = "bad deflatePrime\n";
        goto LAB_001035fe;
      }
      check_dictionary[0x20] = '\x01';
      check_dictionary[0x21] = '\0';
      check_dictionary[0x22] = '\0';
      check_dictionary[0x23] = '\0';
      check_dictionary[8] = '\x01';
      check_dictionary[9] = '\0';
      check_dictionary[10] = '\0';
      check_dictionary[0xb] = '\0';
      uVar7 = zng_deflate(check_dictionary,0);
    } while ((int)uVar7 == 0);
  }
  goto LAB_001035e0;
}

Assistant:

int main(int argc, char *argv[]) {
    unsigned char *compr, *uncompr;
    z_uintmax_t comprLen = 10000*sizeof(int); /* don't overflow on MSDOS */
    z_uintmax_t uncomprLen = comprLen;
    static const char* myVersion = PREFIX2(VERSION);

    if (zVersion()[0] != myVersion[0]) {
        fprintf(stderr, "incompatible zlib version\n");
        exit(1);

    } else if (strcmp(zVersion(), PREFIX2(VERSION)) != 0) {
        fprintf(stderr, "warning: different zlib version linked: %s\n", zVersion());
    }

    printf("zlib-ng version %s = 0x%08lx, compile flags = 0x%lx\n",
            ZLIBNG_VERSION, ZLIBNG_VERNUM, PREFIX(zlibCompileFlags)());

    compr    = (unsigned char*)calloc((unsigned int)comprLen, 1);
    uncompr  = (unsigned char*)calloc((unsigned int)uncomprLen, 1);
    /* compr and uncompr are cleared to avoid reading uninitialized
     * data and to ensure that uncompr compresses well.
     */
    if (compr == NULL || uncompr == NULL)
        error("out of memory\n");

    test_compress(compr, comprLen, uncompr, uncomprLen);

    test_gzio((argc > 1 ? argv[1] : TESTFILE),
              uncompr, uncomprLen);

    test_deflate(compr, comprLen);
    test_inflate(compr, comprLen, uncompr, uncomprLen);

    test_large_deflate(compr, comprLen, uncompr, uncomprLen, 0);
    test_large_inflate(compr, comprLen, uncompr, uncomprLen);

#ifndef ZLIB_COMPAT
    test_large_deflate(compr, comprLen, uncompr, uncomprLen, 1);
    test_large_inflate(compr, comprLen, uncompr, uncomprLen);
#endif

    test_flush(compr, &comprLen);
#ifdef ZLIBNG_ENABLE_TESTS
    test_sync(compr, comprLen, uncompr, uncomprLen);
#endif
    comprLen = uncomprLen;

    test_dict_deflate(compr, comprLen);
    test_dict_inflate(compr, comprLen, uncompr, uncomprLen);

    test_deflate_bound();
    test_deflate_copy(compr, comprLen);
    test_deflate_get_dict(compr, comprLen);
    test_deflate_set_header(compr, comprLen);
    test_deflate_tune(compr, comprLen);
    test_deflate_pending(compr, comprLen);
    test_deflate_prime(compr, comprLen, uncompr, uncomprLen);

    free(compr);
    free(uncompr);

    return 0;
}